

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger base_type(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *ss;
  SQObjectPtr *obj1;
  SQChar *s;
  SQObjectPtr local_20;
  
  obj1 = SQVM::GetAt(v,v->_stackbase + 1);
  ss = v->_sharedstate;
  s = GetTypeName(obj1);
  local_20.super_SQObject._unVal.pString = SQString::Create(ss,s,-1);
  local_20.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  SQVM::Push(v,&local_20);
  SQObjectPtr::~SQObjectPtr(&local_20);
  return 1;
}

Assistant:

static SQInteger base_type(HSQUIRRELVM v)
{
    SQObjectPtr &o = stack_get(v,2);
    v->Push(SQString::Create(_ss(v),GetTypeName(o),-1));
    return 1;
}